

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrXMLWrapper.h
# Opt level: O0

void __thiscall
Assimp::CIrrXML_IOStreamReader::CIrrXML_IOStreamReader
          (CIrrXML_IOStreamReader *this,IOStream *_stream)

{
  IOStream *pIVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  reference pvVar4;
  size_type sVar5;
  char local_79;
  char *local_78;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_70;
  char *local_68;
  const_iterator local_60;
  char *local_58;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_50;
  char local_41;
  char *local_40;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_38;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_30;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> null_char_iter;
  IOStream *_stream_local;
  CIrrXML_IOStreamReader *this_local;
  
  irr::io::IFileReadCallBack::IFileReadCallBack(&this->super_IFileReadCallBack);
  (this->super_IFileReadCallBack)._vptr_IFileReadCallBack =
       (_func_int **)&PTR__CIrrXML_IOStreamReader_00dfda48;
  this->stream = _stream;
  std::vector<char,_std::allocator<char>_>::vector(&this->data);
  this->t = 0;
  iVar3 = (*this->stream->_vptr_IOStream[6])();
  std::vector<char,_std::allocator<char>_>::resize(&this->data,CONCAT44(extraout_var,iVar3));
  pIVar1 = this->stream;
  pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&this->data,0);
  sVar5 = std::vector<char,_std::allocator<char>_>::size(&this->data);
  (*pIVar1->_vptr_IOStream[2])(pIVar1,pvVar4,sVar5,1);
  local_38._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(&this->data);
  local_40 = (char *)std::vector<char,_std::allocator<char>_>::end(&this->data);
  local_41 = '\0';
  local_30 = std::
             find<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,char>
                       (local_38,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                  )local_40,&local_41);
  while( true ) {
    local_50._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(&this->data);
    bVar2 = __gnu_cxx::operator!=(&local_30,&local_50);
    if (!bVar2) break;
    __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
    __normal_iterator<char*>
              ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_60,
               &local_30);
    local_70._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::erase(&this->data,local_60);
    local_58 = local_70._M_current;
    local_30._M_current = local_70._M_current;
    local_78 = (char *)std::vector<char,_std::allocator<char>_>::end(&this->data);
    local_79 = '\0';
    local_68 = (char *)std::
                       find<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,char>
                                 (local_70,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                            )local_78,&local_79);
    local_30 = (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)local_68;
  }
  BaseImporter::ConvertToUTF8(&this->data);
  return;
}

Assistant:

explicit CIrrXML_IOStreamReader(IOStream* _stream)
        : stream (_stream)
        , t (0)
    {

        // Map the buffer into memory and convert it to UTF8. IrrXML provides its
        // own conversion, which is merely a cast from uintNN_t to uint8_t. Thus,
        // it is not suitable for our purposes and we have to do it BEFORE IrrXML
        // gets the buffer. Sadly, this forces us to map the whole file into
        // memory.

        data.resize(stream->FileSize());
        stream->Read(&data[0],data.size(),1);

        // Remove null characters from the input sequence otherwise the parsing will utterly fail
        // std::find is usually much faster than manually iterating
        // It is very unlikely that there will be any null characters
        auto null_char_iter = std::find(data.begin(), data.end(), '\0');

        while (null_char_iter != data.end())
        {
            null_char_iter = data.erase(null_char_iter);
            null_char_iter = std::find(null_char_iter, data.end(), '\0');
        }

        BaseImporter::ConvertToUTF8(data);
    }